

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void Ppmd8_Update2(CPpmd8 *p)

{
  byte bVar1;
  CPpmd8 *p_local;
  
  p->MinContext->SummFreq = p->MinContext->SummFreq + 4;
  bVar1 = p->FoundState->Freq + 4;
  p->FoundState->Freq = bVar1;
  if (0x7c < bVar1) {
    Rescale(p);
  }
  p->RunLength = p->InitRL;
  UpdateModel(p);
  p->MinContext = p->MaxContext;
  return;
}

Assistant:

void Ppmd8_Update2(CPpmd8 *p)
{
  p->MinContext->SummFreq += 4;
  if ((p->FoundState->Freq += 4) > MAX_FREQ)
    Rescale(p);
  p->RunLength = p->InitRL;
  UpdateModel(p);
  p->MinContext = p->MaxContext;
}